

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O2

int usage(char *prg,char *msg,int res)

{
  ostream *poVar1;
  
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,msg);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"  ");
  poVar1 = std::operator<<(poVar1,prg);
  poVar1 = std::operator<<(poVar1," output_file input_file cpp_var_name");
  std::endl<char,std::char_traits<char>>(poVar1);
  return res;
}

Assistant:

int usage( const char *prg, const char *msg, int res ) {
    if ( msg )
        std::cerr << msg << std::endl;
    std::cerr << "Usage:" << std::endl;
    std::cerr << "  " << prg << " output_file input_file cpp_var_name" << std::endl;
    return res;
}